

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_1_12_False(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  float *pfVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  float *pfVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  int scale;
  int iVar44;
  float *pfVar45;
  int k_count;
  bool bVar46;
  byte bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar63 [64];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar87 [12];
  undefined1 auVar86 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  float local_c8;
  
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar54._8_4_ = 0x80000000;
  auVar54._0_8_ = 0x8000000080000000;
  auVar54._12_4_ = 0x80000000;
  auVar95._16_48_ = in_ZMM18._16_48_;
  auVar95._0_16_ = ZEXT416((uint)ipoint->scale);
  auVar63._16_48_ = in_ZmmResult._16_48_;
  auVar48 = vpternlogd_avx512vl(auVar55,auVar95._0_16_,auVar54,0xf8);
  auVar48 = vaddss_avx512f(auVar95._0_16_,auVar48);
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vmulss_avx512f(auVar95._0_16_,auVar95._0_16_);
  fVar64 = -0.08 / auVar49._0_4_;
  scale = (int)auVar48._0_4_;
  auVar49._0_4_ = (int)auVar48._0_4_;
  auVar49._4_4_ = (int)auVar48._4_4_;
  auVar49._8_4_ = (int)auVar48._8_4_;
  auVar49._12_4_ = (int)auVar48._12_4_;
  auVar48 = vcvtdq2ps_avx(auVar49);
  auVar49 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->x),auVar54,0xf8);
  auVar49 = ZEXT416((uint)(ipoint->x + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar52._0_8_ = (double)auVar49._0_4_;
  auVar52._8_8_ = auVar49._8_8_;
  auVar63._0_16_ = vcvtss2sd_avx512f(auVar95._0_16_,auVar95._0_16_);
  auVar96._0_8_ = auVar63._0_8_;
  auVar96._8_56_ = auVar63._8_56_;
  auVar49 = vfmadd231sd_fma(auVar52,auVar96._0_16_,ZEXT816(0x3fe0000000000000));
  auVar53._0_4_ = (float)auVar49._0_8_;
  auVar53._4_12_ = auVar49._4_12_;
  auVar49 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->y),auVar54,0xf8);
  fVar66 = auVar53._0_4_ - auVar48._0_4_;
  auVar49 = ZEXT416((uint)(ipoint->y + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar52 = ZEXT416((uint)fVar66);
  auVar50._0_8_ = (double)auVar49._0_4_;
  auVar50._8_8_ = auVar49._8_8_;
  auVar49 = vfmadd231sd_fma(auVar50,auVar96._0_16_,ZEXT816(0x3fe0000000000000));
  auVar51._0_4_ = (float)auVar49._0_8_;
  auVar51._4_12_ = auVar49._4_12_;
  fVar4 = auVar51._0_4_ - auVar48._0_4_;
  auVar48 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar95._0_16_,auVar53);
  auVar49 = vpternlogd_avx512vl(auVar55,auVar48,auVar54,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  if (scale < (int)auVar48._0_4_) {
    auVar56._8_4_ = 0x3effffff;
    auVar56._0_8_ = 0x3effffff3effffff;
    auVar56._12_4_ = 0x3effffff;
    auVar57._8_4_ = 0x80000000;
    auVar57._0_8_ = 0x8000000080000000;
    auVar57._12_4_ = 0x80000000;
    auVar48 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar95._0_16_,auVar51);
    auVar49 = vpternlogd_avx512vl(auVar57,auVar48,auVar56,0xea);
    auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
    auVar48 = vroundss_avx(auVar48,auVar48,0xb);
    if (scale < (int)auVar48._0_4_) {
      auVar48 = vfmadd231ss_avx512f(auVar53,auVar95._0_16_,ZEXT416(0x41300000));
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar49 = vpternlogd_avx512vl(auVar58,auVar48,auVar56,0xea);
      auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
      auVar48 = vroundss_avx(auVar48,auVar48,0xb);
      if ((int)auVar48._0_4_ + scale <= iimage->width) {
        auVar49 = vfmadd231ss_avx512f(auVar51,auVar95._0_16_,ZEXT416(0x41300000));
        auVar48._8_4_ = 0x80000000;
        auVar48._0_8_ = 0x8000000080000000;
        auVar48._12_4_ = 0x80000000;
        auVar48 = vpternlogd_avx512vl(auVar56,auVar49,auVar48,0xf8);
        auVar48 = ZEXT416((uint)(auVar49._0_4_ + auVar48._0_4_));
        auVar48 = vroundss_avx(auVar48,auVar48,0xb);
        if ((int)auVar48._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar35 = iimage->data;
          iVar16 = scale * 2;
          lVar20 = 0;
          fVar66 = fVar66 + 0.5;
          iVar32 = -0xc;
          pfVar19 = haarResponseY + 0xb;
          pfVar45 = haarResponseX + 0xb;
          do {
            auVar59._0_4_ = (float)iVar32;
            auVar59._4_12_ = in_ZMM10._4_12_;
            lVar27 = 0;
            auVar48 = vfmadd213ss_avx512f(auVar59,auVar95._0_16_,ZEXT416((uint)(fVar4 + 0.5)));
            iVar15 = (int)auVar48._0_4_;
            iVar17 = (iVar15 + -1) * iVar2;
            iVar23 = (iVar15 + -1 + scale) * iVar2;
            iVar15 = (iVar15 + -1 + iVar16) * iVar2;
            do {
              iVar30 = (int)lVar27;
              auVar60._0_4_ = (float)(iVar30 + -0xc);
              auVar89._4_12_ = in_ZMM10._4_12_;
              auVar60._4_12_ = auVar89._4_12_;
              auVar94._0_4_ = (float)(iVar30 + -0xb);
              auVar94._4_12_ = auVar89._4_12_;
              auVar92._0_4_ = (float)(iVar30 + -10);
              auVar92._4_12_ = auVar89._4_12_;
              auVar90._0_4_ = (float)(iVar30 + -9);
              auVar90._4_12_ = auVar89._4_12_;
              auVar48 = vfmadd213ss_avx512f(auVar60,auVar95._0_16_,ZEXT416((uint)fVar66));
              auVar89._0_4_ = (float)(iVar30 + -8);
              auVar49 = vfmadd213ss_avx512f(auVar94,auVar95._0_16_,ZEXT416((uint)fVar66));
              auVar88._0_4_ = (float)(iVar30 + -7);
              auVar87 = in_ZMM14._4_12_;
              auVar88._4_12_ = auVar87;
              auVar53 = ZEXT416((uint)fVar66);
              auVar52 = vfmadd213ss_avx512f(auVar92,auVar95._0_16_,auVar53);
              auVar86._0_4_ = (float)(iVar30 + -6);
              auVar86._4_12_ = auVar87;
              auVar50 = vfmadd213ss_avx512f(auVar90,auVar95._0_16_,auVar53);
              auVar85._0_4_ = (float)(iVar30 + -5);
              auVar85._4_12_ = auVar87;
              auVar51 = vfmadd213ss_avx512f(auVar89,auVar95._0_16_,auVar53);
              iVar38 = (int)auVar48._0_4_;
              auVar83._0_4_ = (float)(iVar30 + -4);
              auVar83._4_12_ = auVar87;
              auVar53 = vfmadd213ss_avx512f(auVar88,auVar95._0_16_,auVar53);
              auVar82._0_4_ = (float)(iVar30 + -3);
              auVar82._4_12_ = auVar87;
              auVar48 = ZEXT416((uint)fVar66);
              auVar54 = vfmadd213ss_avx512f(auVar86,auVar95._0_16_,auVar48);
              auVar79._0_4_ = (float)(iVar30 + -2);
              auVar79._4_12_ = auVar87;
              auVar55 = vfmadd213ss_avx512f(auVar85,auVar95._0_16_,auVar48);
              auVar74._0_4_ = (float)(iVar30 + -1);
              auVar74._4_12_ = auVar87;
              auVar56 = vfmadd213ss_avx512f(auVar83,auVar95._0_16_,auVar48);
              auVar57 = vfmadd213ss_avx512f(auVar82,auVar95._0_16_,auVar48);
              iVar33 = iVar38 + -1 + scale;
              iVar24 = iVar38 + -1 + iVar16;
              auVar58 = vfmadd213ss_avx512f(auVar79,auVar95._0_16_,auVar48);
              auVar59 = vfmadd213ss_avx512f(auVar74,auVar95._0_16_,auVar48);
              iVar42 = (int)auVar49._0_4_;
              auVar49 = vsubss_avx512f(ZEXT416((uint)pfVar35[iVar24 + iVar15]),
                                       ZEXT416((uint)pfVar35[iVar17 + -1 + iVar38]));
              auVar60 = vsubss_avx512f(ZEXT416((uint)pfVar35[iVar15 + -1 + iVar38]),
                                       ZEXT416((uint)pfVar35[iVar17 + iVar24]));
              iVar31 = iVar42 + -1 + scale;
              iVar41 = iVar42 + -1 + iVar16;
              auVar74 = SUB6416(ZEXT464(0x40000000),0);
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar33] -
                                                      pfVar35[iVar33 + iVar15])),auVar74,auVar49);
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar38] -
                                                      pfVar35[iVar23 + iVar24])),auVar74,auVar49);
              auVar48 = vaddss_avx512f(auVar60,auVar48);
              auVar49 = vsubss_avx512f(auVar49,auVar60);
              pfVar45[lVar27 + -0xb] = auVar48._0_4_;
              pfVar19[lVar27 + -0xb] = auVar49._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar42];
              iVar38 = (int)auVar52._0_4_;
              fVar70 = pfVar35[iVar17 + iVar41];
              auVar49 = vsubss_avx512f(ZEXT416((uint)pfVar35[iVar41 + iVar15]),
                                       ZEXT416((uint)pfVar35[iVar17 + -1 + iVar42]));
              iVar33 = iVar38 + -1 + scale;
              iVar24 = iVar38 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar31] -
                                                      pfVar35[iVar31 + iVar15])),auVar74,auVar49);
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar42] -
                                                      pfVar35[iVar23 + iVar41])),auVar74,auVar49);
              pfVar45[lVar27 + -10] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -10] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar42 = (int)auVar50._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar38];
              fVar70 = pfVar35[iVar17 + iVar24];
              iVar40 = iVar42 + -1 + scale;
              iVar41 = iVar42 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar33] -
                                                      pfVar35[iVar33 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar38])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar38] -
                                                      pfVar35[iVar23 + iVar24])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar38])));
              pfVar45[lVar27 + -9] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -9] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar31 = (int)auVar51._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar42];
              fVar70 = pfVar35[iVar17 + iVar41];
              in_ZMM14 = ZEXT464((uint)pfVar35[iVar41 + iVar15]);
              iVar33 = iVar31 + -1 + scale;
              iVar24 = iVar31 + -1 + iVar16;
              auVar49 = ZEXT416((uint)(pfVar35[iVar41 + iVar15] - pfVar35[iVar17 + -1 + iVar42]));
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar40] -
                                                      pfVar35[iVar40 + iVar15])),auVar74,auVar49);
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar42] -
                                                      pfVar35[iVar23 + iVar41])),auVar74,auVar49);
              pfVar45[lVar27 + -8] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -8] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar40 = (int)auVar53._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar31];
              fVar70 = pfVar35[iVar17 + iVar24];
              iVar38 = iVar40 + -1 + scale;
              iVar41 = iVar40 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar33] -
                                                      pfVar35[iVar33 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar31])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar31] -
                                                      pfVar35[iVar23 + iVar24])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar31])));
              pfVar45[lVar27 + -7] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -7] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar42 = (int)auVar54._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar40];
              fVar70 = pfVar35[iVar17 + iVar41];
              iVar44 = iVar42 + -1 + scale;
              iVar24 = iVar42 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar38] -
                                                      pfVar35[iVar38 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar40])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar40] -
                                                      pfVar35[iVar23 + iVar41])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar40])));
              pfVar45[lVar27 + -6] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -6] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar31 = (int)auVar55._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar42];
              fVar70 = pfVar35[iVar17 + iVar24];
              iVar33 = iVar31 + -1 + scale;
              iVar41 = iVar31 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar44] -
                                                      pfVar35[iVar44 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar42])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar42] -
                                                      pfVar35[iVar23 + iVar24])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar42])));
              pfVar45[lVar27 + -5] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -5] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar40 = (int)auVar56._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar31];
              fVar70 = pfVar35[iVar17 + iVar41];
              in_ZMM10 = ZEXT464((uint)pfVar35[iVar41 + iVar15]);
              iVar38 = iVar40 + -1 + scale;
              iVar24 = iVar40 + -1 + iVar16;
              auVar49 = ZEXT416((uint)(pfVar35[iVar41 + iVar15] - pfVar35[iVar17 + -1 + iVar31]));
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar33] -
                                                      pfVar35[iVar33 + iVar15])),auVar74,auVar49);
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar31] -
                                                      pfVar35[iVar23 + iVar41])),auVar74,auVar49);
              pfVar45[lVar27 + -4] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -4] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar42 = (int)auVar57._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar40];
              fVar70 = pfVar35[iVar17 + iVar24];
              iVar33 = iVar42 + -1 + scale;
              iVar41 = iVar42 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar38] -
                                                      pfVar35[iVar38 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar40])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar40] -
                                                      pfVar35[iVar23 + iVar24])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar40])));
              pfVar45[lVar27 + -3] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -3] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar38 = (int)auVar58._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar42];
              fVar70 = pfVar35[iVar17 + iVar41];
              iVar31 = iVar38 + -1 + scale;
              iVar24 = iVar38 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar33] -
                                                      pfVar35[iVar33 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar42])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar42] -
                                                      pfVar35[iVar23 + iVar41])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar42])));
              pfVar45[lVar27 + -2] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -2] = auVar49._0_4_ - (fVar65 - fVar70);
              iVar42 = (int)auVar59._0_4_;
              fVar65 = pfVar35[iVar15 + -1 + iVar38];
              fVar70 = pfVar35[iVar17 + iVar24];
              iVar33 = iVar42 + -1 + scale;
              iVar41 = iVar42 + -1 + iVar16;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar31] -
                                                      pfVar35[iVar31 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar38])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar38] -
                                                      pfVar35[iVar23 + iVar24])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar24 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar38])));
              pfVar45[lVar27 + -1] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27 + -1] = auVar49._0_4_ - (fVar65 - fVar70);
              fVar65 = pfVar35[iVar15 + -1 + iVar42];
              fVar70 = pfVar35[iVar17 + iVar41];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar17 + iVar33] -
                                                      pfVar35[iVar33 + iVar15])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar42])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar23 + -1 + iVar42] -
                                                      pfVar35[iVar23 + iVar41])),auVar74,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar15] -
                                                      pfVar35[iVar17 + -1 + iVar42])));
              pfVar45[lVar27] = (fVar65 - fVar70) + auVar48._0_4_;
              pfVar19[lVar27] = auVar49._0_4_ - (fVar65 - fVar70);
              lVar27 = lVar27 + 0xc;
            } while (iVar30 + -0xc < 0);
            pfVar19 = pfVar19 + 0x18;
            pfVar45 = pfVar45 + 0x18;
            iVar32 = iVar32 + 1;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x18);
          goto LAB_001a55c7;
        }
      }
    }
  }
  iVar2 = scale * 2;
  auVar61 = vbroadcastss_avx512vl(auVar95._0_16_);
  lVar27 = 0;
  lVar20 = 0;
  iVar16 = -0xc;
  auVar96 = auVar95;
  do {
    auVar67._0_4_ = (float)iVar16;
    auVar67._4_12_ = in_ZMM8._4_12_;
    auVar48 = vfmadd213ss_avx512f(auVar67,auVar96._0_16_,ZEXT416((uint)fVar4));
    fVar65 = auVar48._0_4_;
    iVar41 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    iVar17 = iVar2 + iVar41;
    iVar30 = iVar41 + -1 + scale;
    iVar15 = iVar2 + -1 + iVar41;
    iVar23 = iVar41 + -1;
    lVar26 = lVar27;
    pfVar35 = haarResponseX;
    iVar32 = -0xc;
    do {
      pfVar19 = haarResponseY;
      auVar68._0_4_ = (float)iVar32;
      auVar87 = in_ZMM8._4_12_;
      auVar68._4_12_ = auVar87;
      auVar51 = auVar96._0_16_;
      auVar48 = vfmadd213ss_avx512f(auVar68,auVar51,auVar52);
      auVar81._0_4_ = (float)(iVar32 + 1);
      auVar81._4_12_ = auVar87;
      auVar76._0_4_ = (float)(iVar32 + 2);
      auVar76._4_12_ = auVar87;
      auVar72._0_4_ = (float)(iVar32 + 3);
      auVar72._4_12_ = auVar87;
      auVar49 = vfmadd213ss_avx512f(auVar76,auVar51,auVar52);
      auVar50 = vfmadd213ss_avx512f(auVar81,auVar51,auVar52);
      auVar51 = vfmadd213ss_avx512f(auVar72,auVar51,auVar52);
      fVar65 = auVar48._0_4_;
      fVar75 = auVar49._0_4_;
      fVar70 = auVar51._0_4_;
      fVar80 = auVar50._0_4_;
      pfVar45 = (float *)((long)haarResponseY + lVar26);
      iVar24 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
      if (((iVar41 < 1) || (iVar24 < 1)) || (iimage->height < iVar17)) {
LAB_001a45d7:
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,(float *)((long)pfVar35 + lVar26),pfVar45);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
      }
      else {
        iVar42 = iimage->width;
        iVar33 = iVar2 + iVar24;
        if (iVar42 < iVar33) goto LAB_001a45d7;
        iVar31 = iimage->data_width;
        iVar38 = iVar24 + -1 + scale;
        pfVar1 = iimage->data;
        iVar44 = iVar31 * iVar23;
        iVar40 = iVar31 * iVar15;
        fVar65 = pfVar1[iVar40 + -1 + iVar24];
        fVar5 = pfVar1[iVar44 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar44 + iVar38] - pfVar1[iVar40 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar1[iVar40 + -1 + iVar33] -
                                                pfVar1[iVar44 + -1 + iVar24])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar1[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar1[iVar40 + -1 + iVar33] -
                                                pfVar1[iVar44 + -1 + iVar24])));
        *(float *)((long)pfVar35 + lVar26) = (fVar65 - fVar5) + auVar48._0_4_;
        *pfVar45 = auVar49._0_4_ - (fVar65 - fVar5);
      }
      pfVar35 = haarResponseX;
      pfVar45 = (float *)((long)pfVar19 + lVar26 + 4);
      pfVar1 = (float *)((long)haarResponseX + lVar26 + 4);
      iVar24 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar1,pfVar45);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar31 = iimage->data_width;
        iVar38 = iVar24 + -1 + scale;
        pfVar3 = iimage->data;
        iVar40 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar80 = pfVar3[iVar40 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 + iVar38] - pfVar3[iVar44 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar40 + -1 + iVar24])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar40 + -1 + iVar24])));
        *pfVar1 = (fVar65 - fVar80) + auVar48._0_4_;
        *pfVar45 = auVar49._0_4_ - (fVar65 - fVar80);
      }
      pfVar45 = (float *)((long)pfVar19 + lVar26 + 8);
      pfVar1 = (float *)((long)pfVar35 + lVar26 + 8);
      iVar24 = (int)((double)((ulong)(0.0 <= fVar75) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar75) * -0x4020000000000000) + (double)fVar75);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar1,pfVar45);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar38 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar40 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar75 = pfVar3[iVar40 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 + iVar38] - pfVar3[iVar44 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar40 + -1 + iVar24])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar40 + -1 + iVar24])));
        *pfVar1 = (fVar65 - fVar75) + auVar48._0_4_;
        *pfVar45 = auVar49._0_4_ - (fVar65 - fVar75);
      }
      pfVar45 = (float *)((long)pfVar19 + lVar26 + 0xc);
      pfVar1 = (float *)((long)pfVar35 + lVar26 + 0xc);
      iVar24 = (int)((double)((ulong)(0.0 <= fVar70) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar70) * -0x4020000000000000) + (double)fVar70);
      if ((((iVar41 < 1) || (iVar24 < 1)) || (iimage->height < iVar17)) ||
         (iVar33 = iVar2 + iVar24, iVar42 < iVar33)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar1,pfVar45);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar38 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar40 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar40 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 + iVar38] - pfVar3[iVar44 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar40 + -1 + iVar24])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar40 + -1 + iVar24])));
        *pfVar1 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar45 = auVar49._0_4_ - (fVar65 - fVar70);
      }
      auVar62 = vpbroadcastd_avx512vl();
      auVar62 = vpaddd_avx2(auVar62,_DAT_005997c0);
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x10);
      pfVar1 = (float *)((long)pfVar19 + lVar26 + 0x10);
      auVar62 = vcvtdq2ps_avx(auVar62);
      auVar14._4_4_ = fVar66;
      auVar14._0_4_ = fVar66;
      auVar14._8_4_ = fVar66;
      auVar14._12_4_ = fVar66;
      auVar14._16_4_ = fVar66;
      auVar14._20_4_ = fVar66;
      auVar14._24_4_ = fVar66;
      auVar14._28_4_ = fVar66;
      auVar49 = vfmadd132ps_fma(auVar62,auVar14,auVar61);
      auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      uVar21 = vcmpps_avx512vl(ZEXT1632(auVar49),_DAT_005997e0,0xd);
      bVar46 = (bool)((byte)(uVar21 >> 7) & 1);
      iVar24 = (int)((double)((ulong)bVar46 * 0x3fe0000000000000 +
                             (ulong)!bVar46 * -0x4020000000000000) + (double)auVar48._0_4_);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar1);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar38 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar65 - fVar70);
      }
      auVar48 = vpermilpd_avx((undefined1  [16])0x0,1);
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x14);
      pfVar1 = (float *)((long)pfVar19 + lVar26 + 0x14);
      bVar47 = (byte)uVar21;
      iVar24 = (int)((double)((ulong)(bVar47 >> 6 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar47 >> 6 & 1) * -0x4020000000000000) +
                    (double)auVar48._0_4_);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar1);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar38 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar65 - fVar70);
      }
      auVar48 = vmovshdup_avx((undefined1  [16])0x0);
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x18);
      pfVar1 = (float *)((long)pfVar19 + lVar26 + 0x18);
      iVar24 = (int)((double)((ulong)(bVar47 >> 5 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar47 >> 5 & 1) * -0x4020000000000000) +
                    (double)auVar48._0_4_);
      if ((((iVar41 < 1) || (iVar24 < 1)) || (iimage->height < iVar17)) ||
         (iVar33 = iVar2 + iVar24, iVar42 < iVar33)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar1);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar38 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar65 - fVar70);
      }
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x1c);
      pfVar1 = (float *)((long)pfVar19 + lVar26 + 0x1c);
      iVar24 = (int)((double)((ulong)(bVar47 >> 4 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar47 >> 4 & 1) * -0x4020000000000000) + 0.0);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar1);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar38 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar65 - fVar70);
      }
      auVar48 = vpermilps_avx(auVar49,0xff);
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x20);
      pfVar1 = (float *)((long)pfVar19 + lVar26 + 0x20);
      iVar24 = (int)((double)((ulong)(bVar47 >> 3 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar47 >> 3 & 1) * -0x4020000000000000) +
                    (double)auVar48._0_4_);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar1);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar38 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar65 - fVar70);
      }
      auVar48 = vpermilpd_avx(auVar49,1);
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x24);
      pfVar1 = (float *)((long)pfVar19 + lVar26 + 0x24);
      iVar24 = (int)((double)((ulong)(bVar47 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar47 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar48._0_4_);
      if ((((iVar41 < 1) || (iVar24 < 1)) || (iimage->height < iVar17)) ||
         (iVar33 = iVar2 + iVar24, iVar42 < iVar33)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar1);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar38 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar65 - fVar70);
      }
      auVar48 = vmovshdup_avx(auVar49);
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x28);
      pfVar1 = (float *)((long)pfVar19 + lVar26 + 0x28);
      iVar24 = (int)((double)((ulong)(bVar47 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar47 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar48._0_4_);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar1);
        iVar42 = iimage->width;
        pfVar19 = haarResponseY;
        pfVar35 = haarResponseX;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar31 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar31 * iVar23;
        iVar44 = iVar31 * iVar15;
        fVar65 = pfVar3[iVar44 + -1 + iVar24];
        fVar70 = pfVar3[iVar38 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar31 * iVar30 + -1 + iVar24] -
                                                pfVar3[iVar31 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar33] -
                                                pfVar3[iVar38 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar1 = auVar50._0_4_ - (fVar65 - fVar70);
      }
      local_c8 = auVar49._0_4_;
      pfVar45 = (float *)((long)pfVar35 + lVar26 + 0x2c);
      pfVar19 = (float *)((long)pfVar19 + lVar26 + 0x2c);
      iVar24 = (int)((double)((ulong)(bVar47 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar47 & 1) * -0x4020000000000000) + (double)local_c8);
      if (((iVar41 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar17 || (iVar33 = iVar2 + iVar24, iVar42 < iVar33)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar41,iVar24,scale,pfVar45,pfVar19);
        pfVar35 = haarResponseX;
      }
      else {
        iVar42 = iimage->data_width;
        pfVar1 = iimage->data;
        iVar31 = iVar24 + -1 + scale;
        iVar40 = iVar42 * iVar23;
        iVar38 = iVar42 * iVar15;
        fVar65 = pfVar1[iVar38 + -1 + iVar24];
        fVar70 = pfVar1[iVar40 + -1 + iVar33];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar40 + iVar31] - pfVar1[iVar38 + iVar31]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar1[iVar38 + -1 + iVar33] -
                                                pfVar1[iVar40 + -1 + iVar24])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar42 * iVar30 + -1 + iVar24] -
                                                pfVar1[iVar42 * iVar30 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar1[iVar38 + -1 + iVar33] -
                                                pfVar1[iVar40 + -1 + iVar24])));
        *pfVar45 = (fVar65 - fVar70) + auVar48._0_4_;
        *pfVar19 = auVar49._0_4_ - (fVar65 - fVar70);
      }
      auVar96 = ZEXT1664(auVar95._0_16_);
      lVar26 = lVar26 + 0x30;
      bVar46 = iVar32 < 0;
      iVar32 = iVar32 + 0xc;
    } while (bVar46);
    iVar16 = iVar16 + 1;
    lVar20 = lVar20 + 1;
    lVar27 = lVar27 + 0x60;
  } while (lVar20 != 0x18);
LAB_001a55c7:
  auVar48 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x3f000000));
  auVar93._8_4_ = 0x3effffff;
  auVar93._0_8_ = 0x3effffff3effffff;
  auVar93._12_4_ = 0x3effffff;
  auVar91._8_4_ = 0x80000000;
  auVar91._0_8_ = 0x8000000080000000;
  auVar91._12_4_ = 0x80000000;
  auVar49 = vpternlogd_avx512vl(auVar93,auVar48,auVar91,0xf8);
  auVar52 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x3fc00000));
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar93,auVar52,auVar91,0xf8);
  auVar50 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x40200000));
  auVar49 = ZEXT416((uint)(auVar52._0_4_ + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar52 = vpternlogd_avx512vl(auVar93,auVar50,auVar91,0xf8);
  auVar51 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x40600000));
  auVar52 = ZEXT416((uint)(auVar50._0_4_ + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar50 = vpternlogd_avx512vl(auVar93,auVar51,auVar91,0xf8);
  auVar53 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x40900000));
  auVar50 = ZEXT416((uint)(auVar51._0_4_ + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar93,auVar53,auVar91,0xf8);
  auVar54 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x40b00000));
  auVar51 = ZEXT416((uint)(auVar53._0_4_ + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar53 = vpternlogd_avx512vl(auVar93,auVar54,auVar91,0xf8);
  auVar55 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x40d00000));
  auVar53 = ZEXT416((uint)(auVar54._0_4_ + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar93,auVar55,auVar91,0xf8);
  auVar56 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x40f00000));
  auVar54 = ZEXT416((uint)(auVar55._0_4_ + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar93,auVar56,auVar91,0xf8);
  auVar57 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x41080000));
  auVar55 = ZEXT416((uint)(auVar55._0_4_ + auVar56._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar93,auVar57,auVar91,0xf8);
  auVar58 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x41180000));
  auVar56 = ZEXT416((uint)(auVar57._0_4_ + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar93,auVar58,auVar91,0xf8);
  auVar59 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x41280000));
  auVar57 = ZEXT416((uint)(auVar58._0_4_ + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar93,auVar59,auVar91,0xf8);
  auVar60 = vmulss_avx512f(auVar95._0_16_,ZEXT416(0x41380000));
  auVar58 = ZEXT416((uint)(auVar59._0_4_ + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar93,auVar60,auVar91,0xf8);
  fVar71 = auVar52._0_4_;
  fVar66 = fVar71 + auVar49._0_4_;
  fVar4 = fVar71 + auVar48._0_4_;
  auVar52 = ZEXT416((uint)(auVar60._0_4_ + auVar59._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  fVar65 = fVar71 - auVar48._0_4_;
  fVar70 = fVar71 - auVar49._0_4_;
  fVar75 = fVar71 - auVar50._0_4_;
  fVar80 = fVar71 - auVar51._0_4_;
  fVar5 = fVar71 - auVar53._0_4_;
  fVar71 = fVar71 - auVar54._0_4_;
  fVar84 = auVar55._0_4_;
  fVar6 = fVar84 - auVar50._0_4_;
  fVar7 = fVar84 - auVar51._0_4_;
  fVar8 = fVar84 - auVar53._0_4_;
  fVar9 = fVar84 - auVar54._0_4_;
  fVar10 = fVar84 - auVar56._0_4_;
  fVar11 = fVar84 - auVar57._0_4_;
  fVar12 = fVar84 - auVar58._0_4_;
  fVar84 = fVar84 - auVar52._0_4_;
  gauss_s1_c0[0] = expf(fVar66 * fVar66 * fVar64);
  gauss_s1_c0[1] = expf(fVar4 * fVar4 * fVar64);
  gauss_s1_c0[2] = expf(fVar65 * fVar65 * fVar64);
  gauss_s1_c0[3] = expf(fVar70 * fVar70 * fVar64);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar75 * fVar75 * fVar64);
  gauss_s1_c0[6] = expf(fVar80 * fVar80 * fVar64);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar64);
  gauss_s1_c0[8] = expf(fVar71 * fVar71 * fVar64);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar64);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar64);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar64);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar64);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar64);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar64);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar64);
  gauss_s1_c1[8] = expf(fVar84 * fVar84 * fVar64);
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  uVar21 = 0xfffffff8;
  fVar66 = 0.0;
  lVar20 = 0;
  lVar27 = 0;
  local_c8 = 0.0;
  do {
    pfVar35 = gauss_s1_c1;
    uVar18 = (uint)uVar21;
    if (uVar18 != 7) {
      pfVar35 = gauss_s1_c0;
    }
    lVar26 = (long)(int)local_c8;
    lVar27 = (long)(int)lVar27;
    if (uVar18 == 0xfffffff8) {
      pfVar35 = gauss_s1_c1;
    }
    uVar39 = 0;
    local_c8 = (float)((int)local_c8 + 4);
    uVar34 = 0xfffffff8;
    lVar36 = (long)haarResponseX + lVar20;
    lVar28 = (long)haarResponseY + lVar20;
    do {
      pfVar45 = gauss_s1_c1;
      if (uVar34 != 7) {
        pfVar45 = gauss_s1_c0;
      }
      auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar34 == 0xfffffff8) {
        pfVar45 = gauss_s1_c1;
      }
      uVar22 = (ulong)(uVar34 >> 0x1c & 0xfffffff8);
      uVar25 = uVar39;
      lVar29 = lVar28;
      lVar43 = lVar36;
      do {
        lVar37 = 0;
        pfVar19 = (float *)((long)pfVar35 + (ulong)(uint)((int)(uVar21 >> 0x1f) << 5));
        do {
          fVar4 = pfVar45[uVar22] * *pfVar19;
          pfVar19 = pfVar19 + (ulong)(~uVar18 >> 0x1f) * 2 + -1;
          auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar29 + lVar37 * 4)),
                                  ZEXT416(*(uint *)(lVar43 + lVar37 * 4)),0x10);
          lVar37 = lVar37 + 1;
          auVar78._0_4_ = fVar4 * auVar48._0_4_;
          auVar78._4_4_ = fVar4 * auVar48._4_4_;
          auVar78._8_4_ = fVar4 * auVar48._8_4_;
          auVar78._12_4_ = fVar4 * auVar48._12_4_;
          auVar48 = vandps_avx(auVar78,auVar69);
          auVar48 = vmovlhps_avx(auVar78,auVar48);
          auVar73._0_4_ = auVar96._0_4_ + auVar48._0_4_;
          auVar73._4_4_ = auVar96._4_4_ + auVar48._4_4_;
          auVar73._8_4_ = auVar96._8_4_ + auVar48._8_4_;
          auVar73._12_4_ = auVar96._12_4_ + auVar48._12_4_;
          auVar96 = ZEXT1664(auVar73);
        } while (lVar37 != 9);
        uVar25 = uVar25 + 0x18;
        uVar22 = uVar22 + (ulong)(-1 < (int)uVar34) * 2 + -1;
        lVar43 = lVar43 + 0x60;
        lVar29 = lVar29 + 0x60;
      } while (uVar25 < uVar34 * 0x18 + 0x198);
      uVar34 = uVar34 + 5;
      uVar39 = uVar39 + 0x78;
      fVar4 = gauss_s2_arr[lVar26];
      auVar13._4_4_ = fVar4;
      auVar13._0_4_ = fVar4;
      auVar13._8_4_ = fVar4;
      auVar13._12_4_ = fVar4;
      auVar50 = vmulps_avx512vl(auVar73,auVar13);
      lVar26 = lVar26 + 1;
      auVar77._0_4_ = auVar50._0_4_ * auVar50._0_4_;
      auVar77._4_4_ = auVar50._4_4_ * auVar50._4_4_;
      auVar77._8_4_ = auVar50._8_4_ * auVar50._8_4_;
      auVar77._12_4_ = auVar50._12_4_ * auVar50._12_4_;
      auVar49 = vshufpd_avx(auVar50,auVar50,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar27) = auVar50;
      lVar27 = lVar27 + 4;
      lVar36 = lVar36 + 0x1e0;
      lVar28 = lVar28 + 0x1e0;
      auVar48 = vmovshdup_avx(auVar77);
      auVar52 = vfmadd231ss_fma(auVar48,auVar50,auVar50);
      auVar48 = vshufps_avx(auVar50,auVar50,0xff);
      auVar49 = vfmadd213ss_fma(auVar49,auVar49,auVar52);
      auVar48 = vfmadd213ss_fma(auVar48,auVar48,auVar49);
      fVar66 = fVar66 + auVar48._0_4_;
    } while (local_c8 != (float)(int)lVar26);
    lVar20 = lVar20 + 0x14;
    uVar21 = (ulong)(uVar18 + 5);
  } while ((int)uVar18 < 3);
  if (fVar66 < 0.0) {
    fVar66 = sqrtf(fVar66);
  }
  else {
    auVar48 = vsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
    fVar66 = auVar48._0_4_;
  }
  lVar20 = 0;
  auVar96 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar66)));
  do {
    auVar63 = vmulps_avx512f(auVar96,*(undefined1 (*) [64])(ipoint->descriptor + lVar20));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar20) = auVar63;
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_12_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}